

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

unit units::root(unit *un,int power)

{
  int in_ESI;
  unit *in_RDI;
  double dVar1;
  int in_stack_00000054;
  unit_data *in_stack_00000058;
  int in_stack_ffffffffffffffe4;
  unit_data in_stack_ffffffffffffffe8;
  unit local_8;
  
  if (in_ESI == 0) {
    local_8.multiplier_ = 1.0;
    local_8.base_units_ = (unit_data)0x0;
  }
  else {
    dVar1 = unit::multiplier(in_RDI);
    if ((0.0 <= dVar1) || (in_ESI % 2 != 0)) {
      unit::multiplier(in_RDI);
      dVar1 = numericalRoot<double>
                        ((double)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                         in_stack_ffffffffffffffe4);
      unit::base_units(in_RDI);
      detail::unit_data::root(in_stack_00000058,in_stack_00000054);
      unit::unit(&local_8,dVar1,(unit_data *)&stack0xffffffffffffffe8);
    }
    else {
      local_8.multiplier_ = 1.0;
      local_8.base_units_ = (unit_data)0xfa94a488;
    }
  }
  return local_8;
}

Assistant:

unit root(const unit& un, int power)
{
    if (power == 0) {
        return one;
    }
    if (un.multiplier() < 0.0 && power % 2 == 0) {
        return error;
    }
    return unit{
        numericalRoot(un.multiplier(), power), un.base_units().root(power)};
}